

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O2

void __thiscall
prevector<8U,_int,_unsigned_int,_int>::resize
          (prevector<8U,_int,_unsigned_int,_int> *this,size_type new_size)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  prevector<8U,_int,_unsigned_int,_int> *ppVar5;
  int iVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = this->_size;
  uVar2 = uVar3 - 9;
  if (uVar3 < 9) {
    uVar2 = uVar3;
  }
  iVar6 = new_size - uVar2;
  if (iVar6 != 0) {
    if (new_size < uVar2) {
      ppVar5 = this;
      if (8 < uVar3) {
        ppVar5 = (prevector<8U,_int,_unsigned_int,_int> *)(this->_union).indirect_contents.indirect;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        erase(this,(int *)((long)&ppVar5->_union + (long)(int)new_size * 4),
              (int *)((long)&ppVar5->_union + (long)(int)uVar2 * 4));
        return;
      }
      goto LAB_00446264;
    }
    if (uVar3 < 9) {
      uVar4 = 8;
    }
    else {
      uVar4 = (this->_union).indirect_contents.capacity;
    }
    if (uVar4 < new_size) {
      change_capacity(this,new_size);
      uVar3 = this->_size;
    }
    ppVar5 = this;
    if (8 < uVar3) {
      ppVar5 = (prevector<8U,_int,_unsigned_int,_int> *)(this->_union).indirect_contents.indirect;
    }
    std::__fill_n_a<int*,long,int>((long)&ppVar5->_union + (long)(int)uVar2 * 4,iVar6);
    this->_size = this->_size + iVar6;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00446264:
  __stack_chk_fail();
}

Assistant:

void resize(size_type new_size) {
        size_type cur_size = size();
        if (cur_size == new_size) {
            return;
        }
        if (cur_size > new_size) {
            erase(item_ptr(new_size), end());
            return;
        }
        if (new_size > capacity()) {
            change_capacity(new_size);
        }
        ptrdiff_t increase = new_size - cur_size;
        fill(item_ptr(cur_size), increase);
        _size += increase;
    }